

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O0

void BMP_Free(BMP *bmp)

{
  BMP *bmp_local;
  
  if (bmp != (BMP *)0x0) {
    if (bmp->Palette != (uchar *)0x0) {
      free(bmp->Palette);
    }
    if (bmp->Data != (uchar *)0x0) {
      free(bmp->Data);
    }
    free(bmp);
    BMP_LAST_ERROR_CODE = BMP_OK;
  }
  return;
}

Assistant:

void BMP_Free( BMP* bmp )
{
	if ( bmp == NULL )
	{
		return;
	}

	if ( bmp->Palette != NULL )
	{
		free( bmp->Palette );
	}

	if ( bmp->Data != NULL )
	{
		free( bmp->Data );
	}

	free( bmp );

	BMP_LAST_ERROR_CODE = BMP_OK;
}